

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_Event.h
# Opt level: O0

bool __thiscall
axl::sys::NameableEventBase<axl::sl::False>::create
          (NameableEventBase<axl::sl::False> *this,StringRef *name)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  int iVar4;
  EventImpl *pEVar5;
  pthread_condattr_t *this_00;
  char *in_RSI;
  NameableEventBase<axl::sl::False> *in_RDI;
  SharedMemory sharedMemory;
  bool result;
  MutexAttr mutexAttr;
  CondAttr condAttr;
  StringRef *in_stack_ffffffffffffff88;
  pthread_mutexattr_t *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  int fd;
  pthread_condattr_t *condAttr_00;
  undefined8 in_stack_ffffffffffffffa0;
  Mapping *size;
  void *in_stack_ffffffffffffffb0;
  undefined2 in_stack_ffffffffffffffb8;
  undefined1 uVar6;
  undefined1 in_stack_ffffffffffffffbd;
  undefined1 uVar7;
  Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_> in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar8;
  uint uVar9;
  undefined4 in_stack_ffffffffffffffd4;
  MutexAttr local_20;
  CondAttr local_1c;
  char *local_18;
  byte local_1;
  
  fd = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  local_18 = in_RSI;
  close(in_RDI,(int)in_RSI);
  psx::CondAttr::CondAttr((CondAttr *)in_stack_ffffffffffffff90);
  psx::MutexAttr::MutexAttr((MutexAttr *)in_stack_ffffffffffffff90);
  uVar1 = psx::CondAttr::setProcessShared
                    ((CondAttr *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8.m_h),
                     (int)((ulong)in_RDI >> 0x20));
  uVar7 = false;
  if ((bool)uVar1) {
    in_stack_ffffffffffffffbd =
         psx::MutexAttr::setProcessShared
                   ((MutexAttr *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8.m_h),
                    (int)((ulong)in_RDI >> 0x20));
    uVar7 = in_stack_ffffffffffffffbd;
  }
  uVar8 = CONCAT13(uVar7,(int3)in_stack_ffffffffffffffd0);
  if ((bool)uVar7 == false) {
    local_1 = 0;
  }
  else {
    io::psx::SharedMemory::SharedMemory((SharedMemory *)0x1a785b);
    iVar4 = io::psx::SharedMemory::open
                      ((SharedMemory *)&stack0xffffffffffffffc8,local_18,0xc2,0x1b6);
    uVar2 = (undefined1)iVar4;
    uVar9 = CONCAT13(uVar2,(int3)uVar8) & 0x1ffffff;
    if ((char)(uVar9 >> 0x18) == '\0') {
      local_1 = 0;
    }
    else {
      uVar3 = io::psx::File::setSize
                        ((File *)in_stack_ffffffffffffff90,(uint64_t)in_stack_ffffffffffffff88);
      uVar6 = false;
      if ((bool)uVar3) {
        size = &in_RDI->m_mapping;
        sl::Handle::operator_cast_to_int((Handle *)&stack0xffffffffffffffc8);
        in_stack_ffffffffffffff88 = (StringRef *)0x0;
        pEVar5 = (EventImpl *)
                 io::psx::Mapping::map
                           ((Mapping *)
                            CONCAT17(uVar1,CONCAT16(uVar7,CONCAT15(in_stack_ffffffffffffffbd,
                                                                   CONCAT14(uVar2,CONCAT13(uVar3,
                                                  CONCAT12(uVar6,in_stack_ffffffffffffffb8)))))),
                            in_stack_ffffffffffffffb0,(size_t)size,
                            (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                            (uint_t)in_stack_ffffffffffffffa0,fd,
                            CONCAT44(in_stack_ffffffffffffffd4,uVar9));
        in_RDI->m_event = pEVar5;
        uVar6 = pEVar5 != (EventImpl *)0x0;
      }
      if ((bool)uVar6 == false) {
        io::psx::SharedMemory::unlink(local_18);
        local_1 = 0;
      }
      else {
        condAttr_00 = (pthread_condattr_t *)in_RDI->m_event;
        this_00 = psx::CondAttr::operator_cast_to_pthread_condattr_t_(&local_1c);
        psx::MutexAttr::operator_cast_to_pthread_mutexattr_t_(&local_20);
        CondMutexEventBase<axl::sl::False>::CondMutexEventBase
                  ((CondMutexEventBase<axl::sl::False> *)this_00,condAttr_00,
                   in_stack_ffffffffffffff90);
        sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::operator=
                  ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)in_stack_ffffffffffffff90,
                   in_stack_ffffffffffffff88);
        local_1 = 1;
      }
    }
    io::psx::SharedMemory::~SharedMemory((SharedMemory *)0x1a79d6);
  }
  psx::MutexAttr::~MutexAttr((MutexAttr *)in_stack_ffffffffffffff90);
  psx::CondAttr::~CondAttr((CondAttr *)in_stack_ffffffffffffff90);
  return (bool)(local_1 & 1);
}

Assistant:

bool
	create(const sl::StringRef& name) {
		close();

		psx::CondAttr condAttr;
		psx::MutexAttr mutexAttr;

		bool result =
			condAttr.setProcessShared(PTHREAD_PROCESS_SHARED) &&
			mutexAttr.setProcessShared(PTHREAD_PROCESS_SHARED);

		if (!result)
			return false;

		io::psx::SharedMemory sharedMemory;
		result = sharedMemory.open(name, O_RDWR | O_CREAT | O_EXCL);
		if (!result)
			return false;

		result =
			sharedMemory.setSize(sizeof(EventImpl)) &&
			(m_event = (EventImpl*)m_mapping.map(
				NULL,
				sizeof(EventImpl),
				PROT_READ | PROT_WRITE,
				MAP_SHARED,
				sharedMemory
			));

		if (!result) {
			sharedMemory.unlink(name);
			return false;
		}

		new (m_event) EventImpl(condAttr, mutexAttr);
		m_name = name;
		return true;
	}